

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O0

GdlFeatureSetting * __thiscall GdlFeatureDefn::FindSetting(GdlFeatureDefn *this,string *sta)

{
  __type _Var1;
  size_type_conflict sVar2;
  reference ppGVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  ulong local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  local_20 = 0;
  __lhs = in_RDI;
  while( true ) {
    sVar2 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::size
                      ((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                       (in_RDI + 0x70));
    if (sVar2 <= local_20) {
      return (GdlFeatureSetting *)0x0;
    }
    std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::operator[]
              ((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)(in_RDI + 0x70),
               local_20);
    _Var1 = std::operator==(__lhs,in_RSI);
    if (_Var1) break;
    local_20 = local_20 + 1;
  }
  ppGVar3 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::operator[]
                      ((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                       (in_RDI + 0x70),local_20);
  return *ppGVar3;
}

Assistant:

GdlFeatureSetting * GdlFeatureDefn::FindSetting(std::string sta)
{
	for (size_t i = 0; i < m_vpfset.size(); ++i)
	{
		if (m_vpfset[i]->m_staName == sta)
			return m_vpfset[i];
	}
	return NULL;
}